

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

SC_Cell * Abc_SclFindInvertor(SC_Lib *p,int fFindBuff)

{
  int iVar1;
  word wVar2;
  SC_Pin *pSVar3;
  word wVar4;
  SC_Cell *local_40;
  int local_2c;
  int k;
  word Truth;
  SC_Cell *pCell;
  int fFindBuff_local;
  SC_Lib *p_local;
  
  Truth = 0;
  wVar2 = 0x5555555555555555;
  if (fFindBuff != 0) {
    wVar2 = 0xaaaaaaaaaaaaaaaa;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(&p->vCellClasses), local_2c < iVar1;
      local_2c = local_2c + 1) {
    Truth = (word)Vec_PtrEntry(&p->vCellClasses,local_2c);
    if (((SC_Cell *)Truth)->n_inputs == 1) {
      pSVar3 = SC_CellPin((SC_Cell *)Truth,1);
      wVar4 = Vec_WrdEntry(&pSVar3->vFunc,0);
      if (wVar4 == wVar2) break;
    }
  }
  if ((SC_Cell *)Truth == (SC_Cell *)0x0) {
    local_40 = (SC_Cell *)0x0;
  }
  else {
    local_40 = ((SC_Cell *)Truth)->pRepr;
  }
  return local_40;
}

Assistant:

SC_Cell * Abc_SclFindInvertor( SC_Lib * p, int fFindBuff )
{
    SC_Cell * pCell = NULL;
    word Truth = fFindBuff ? ABC_CONST(0xAAAAAAAAAAAAAAAA) : ABC_CONST(0x5555555555555555);
    int k;
    SC_LibForEachCellClass( p, pCell, k )
        if ( pCell->n_inputs == 1 && Vec_WrdEntry(&SC_CellPin(pCell, 1)->vFunc, 0) == Truth )
            break;
    // take representative
    return pCell ? pCell->pRepr : NULL;
}